

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

bool __thiscall llvm::DWARFVerifier::handleDebugInfo(DWARFVerifier *this)

{
  DWARFObject *pDVar1;
  StringRef Str;
  StringRef Str_00;
  int *local_40;
  DWARFVerifier *local_38;
  int local_2c [2];
  uint NumErrors;
  
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  local_2c[0] = 0;
  Str.Length = 0x2b;
  Str.Data = "Verifying .debug_info Unit Header Chain...\n";
  raw_ostream::operator<<(this->OS,Str);
  local_40 = local_2c;
  local_38 = this;
  (*pDVar1->_vptr_DWARFObject[7])
            (pDVar1,function_ref<void(llvm::DWARFSection_const&)>::
                    callback_fn<llvm::DWARFVerifier::handleDebugInfo()::__0>,&local_40);
  Str_00.Length = 0x2c;
  Str_00.Data = "Verifying .debug_types Unit Header Chain...\n";
  raw_ostream::operator<<(this->OS,Str_00);
  local_40 = local_2c;
  local_38 = this;
  (*pDVar1->_vptr_DWARFObject[8])
            (pDVar1,function_ref<void(llvm::DWARFSection_const&)>::
                    callback_fn<llvm::DWARFVerifier::handleDebugInfo()::__1>,&local_40);
  return local_2c[0] == 0;
}

Assistant:

bool DWARFVerifier::handleDebugInfo() {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  unsigned NumErrors = 0;

  OS << "Verifying .debug_info Unit Header Chain...\n";
  DObj.forEachInfoSections([&](const DWARFSection &S) {
    NumErrors += verifyUnitSection(S, DW_SECT_INFO);
  });

  OS << "Verifying .debug_types Unit Header Chain...\n";
  DObj.forEachTypesSections([&](const DWARFSection &S) {
    NumErrors += verifyUnitSection(S, DW_SECT_TYPES);
  });
  return NumErrors == 0;
}